

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_rectfill_quint16(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  Format FVar1;
  uint y_00;
  uchar *puVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  unsigned_short value;
  int in_ESI;
  QRasterBuffer *in_RDI;
  undefined4 in_R8D;
  QRgba64 *in_R9;
  long in_FS_OFFSET;
  QPixelLayout *layout;
  quint16 c16;
  quint32 c32;
  int in_stack_ffffffffffffffb0;
  ushort local_e;
  uint local_c;
  long local_8;
  
  value = (unsigned_short)((uint)in_EDX >> 0x10);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FVar1 = in_RDI->format;
  local_c = QRgba64::toArgb32(in_R9);
  local_e = 0xaaaa;
  (*qPixelLayouts[FVar1].storeFromARGB32PM)
            ((uchar *)&local_e,&local_c,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  puVar2 = QRasterBuffer::buffer(in_RDI);
  y_00 = (uint)local_e;
  QRasterBuffer::bytesPerLine(in_RDI);
  qt_rectfill<unsigned_short>
            ((unsigned_short *)CONCAT44(in_R8D,in_ECX),value,in_ESI,y_00,in_stack_ffffffffffffffb0,
             (int)((ulong)puVar2 >> 0x20),(qsizetype)in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_quint16(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const QPixelLayout &layout = qPixelLayouts[rasterBuffer->format];
    quint32 c32 = color.toArgb32();
    quint16 c16;
    layout.storeFromARGB32PM(reinterpret_cast<uchar *>(&c16), &c32, 0, 1, nullptr, nullptr);
    qt_rectfill<quint16>(reinterpret_cast<quint16 *>(rasterBuffer->buffer()),
                         c16, x, y, width, height, rasterBuffer->bytesPerLine());
}